

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::
AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema>::AssignMessageDescriptor
          (AssignDescriptorsHelper<google::protobuf::internal::MigrationSchema> *this,
          Descriptor *descriptor)

{
  int iVar1;
  MigrationSchema *pMVar2;
  uint32 *puVar3;
  GeneratedMessageReflection *this_00;
  DescriptorPool *pool;
  Metadata *pMVar4;
  int i_1;
  int *piVar5;
  int i;
  long lVar6;
  long lVar7;
  ReflectionSchema result;
  
  lVar7 = 0;
  for (lVar6 = 0; lVar6 < *(int *)(descriptor + 0x48); lVar6 = lVar6 + 1) {
    AssignMessageDescriptor(this,(Descriptor *)(*(long *)(descriptor + 0x50) + lVar7));
    lVar7 = lVar7 + 0xa8;
  }
  pMVar4 = this->file_level_metadata_;
  pMVar4->descriptor = descriptor;
  if (*(char *)(*(long *)(descriptor + 0x20) + 0x6b) == '\0') {
    this_00 = (GeneratedMessageReflection *)operator_new(0x58);
    pMVar2 = this->schemas_;
    puVar3 = this->offsets_;
    lVar6._0_4_ = pMVar2->offsets_index;
    lVar6._4_4_ = pMVar2->has_bit_indices_index;
    result.object_size_ = pMVar2->object_size;
    result.default_instance_ = *this->default_instance_data_;
    lVar7 = lVar6 << 0x20;
    piVar5 = (int *)((lVar7 >> 0x1e) + (long)puVar3);
    result.offsets_ = (uint32 *)(piVar5 + 5);
    result.has_bit_indices_ = puVar3 + (lVar6 >> 0x20);
    result.has_bits_offset_ = *piVar5;
    result.metadata_offset_ = *(int *)((long)puVar3 + (lVar7 + 0x100000000 >> 0x1e));
    result.extensions_offset_ = *(int *)((long)puVar3 + (lVar7 + 0x200000000 >> 0x1e));
    result.oneof_case_offset_ = *(int *)((long)puVar3 + (lVar7 + 0x300000000 >> 0x1e));
    result.weak_field_map_offset_ = *(int *)((long)puVar3 + (lVar7 + 0x400000000 >> 0x1e));
    pool = DescriptorPool::generated_pool();
    GeneratedMessageReflection::GeneratedMessageReflection
              (this_00,descriptor,&result,pool,this->factory_);
    this->file_level_metadata_->reflection = (Reflection *)this_00;
    iVar1 = *(int *)(descriptor + 0x58);
    lVar6 = 0;
    for (lVar7 = 0; lVar7 < iVar1; lVar7 = lVar7 + 1) {
      *this->file_level_enum_descriptors_ = (EnumDescriptor *)(*(long *)(descriptor + 0x60) + lVar6)
      ;
      this->file_level_enum_descriptors_ = this->file_level_enum_descriptors_ + 1;
      lVar6 = lVar6 + 0x38;
    }
    this->schemas_ = this->schemas_ + 1;
    pMVar4 = this->file_level_metadata_;
  }
  this->default_instance_data_ = this->default_instance_data_ + 1;
  this->file_level_metadata_ = pMVar4 + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    file_level_metadata_->descriptor = descriptor;

    if (!descriptor->options().map_entry()) {
      // Only set reflection for non map types.
      file_level_metadata_->reflection = new GeneratedMessageReflection(
          descriptor, MigrationToReflectionSchema(default_instance_data_,
                                                  offsets_, *schemas_),
          ::google::protobuf::DescriptorPool::generated_pool(), factory_);
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
        AssignEnumDescriptor(descriptor->enum_type(i));
      }
      schemas_++;
    }
    default_instance_data_++;
    file_level_metadata_++;
  }